

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgload.c
# Opt level: O0

FT_Error tt_loader_init(TT_Loader loader,TT_Size size,TT_GlyphSlot glyph,FT_Int32 load_flags,
                       FT_Bool glyf_table_only)

{
  FT_Driver pFVar1;
  TT_Face face_00;
  FT_Stream pFVar2;
  TT_ExecContext exec_00;
  FT_GlyphLoader loader_00;
  byte pedantic_00;
  FT_Error FVar3;
  uint uVar4;
  FT_Int32 FVar5;
  bool bVar6;
  bool bVar7;
  bool local_6c;
  bool local_6b;
  bool local_6a;
  byte local_69;
  FT_GlyphLoader gloader;
  FT_UInt i;
  FT_Bool reexecute;
  FT_Bool grayscale_cleartype;
  FT_Bool subpixel_hinting_lean;
  FT_Bool grayscale;
  TT_ExecContext exec;
  TT_Driver driver;
  FT_Bool pedantic;
  FT_Error error;
  FT_Stream stream;
  TT_Face face;
  FT_Bool glyf_table_only_local;
  FT_Int32 load_flags_local;
  TT_GlyphSlot glyph_local;
  TT_Size size_local;
  TT_Loader loader_local;
  
  pedantic_00 = (byte)load_flags & 0x80;
  pFVar1 = glyph->face->driver;
  face_00 = (TT_Face)glyph->face;
  pFVar2 = (face_00->root).stream;
  memset(loader,0,0x178);
  face._4_4_ = load_flags;
  if (((load_flags & 2U) == 0) && (glyf_table_only == '\0')) {
    gloader._4_1_ = false;
    if ((size->bytecode_ready < 0) || (size->cvt_ready < 0)) {
      FVar3 = tt_size_ready_bytecode(size,pedantic_00);
      if (FVar3 != 0) {
        return FVar3;
      }
    }
    else {
      if (size->bytecode_ready != 0) {
        return size->bytecode_ready;
      }
      if (size->cvt_ready != 0) {
        return size->cvt_ready;
      }
    }
    exec_00 = size->context;
    if (exec_00 == (TT_ExecContext)0x0) {
      return 0x99;
    }
    uVar4 = load_flags >> 0x10;
    if (*(int *)&pFVar1[2].root.library == 0x28) {
      gloader._6_1_ = (uVar4 & 0xf) != 2;
      local_69 = 0;
      if (gloader._6_1_) {
        local_6a = (load_flags & 0x30000U) != 0 || (load_flags & 0x40000U) != 0;
        local_69 = local_6a ^ 0xff;
      }
      gloader._5_1_ = local_69 & 1;
      local_6b = gloader._6_1_ && (load_flags & 0x40000U) != 0;
      exec_00->vertical_lcd_lean = local_6b;
    }
    else {
      gloader._6_1_ = false;
      gloader._5_1_ = 0;
      exec_00->vertical_lcd_lean = '\0';
    }
    if (*(int *)&pFVar1[2].root.library == 0x28) {
      local_6c = gloader._6_1_ == false && (uVar4 & 0xf) != 2;
      gloader._7_1_ = local_6c;
    }
    else {
      gloader._7_1_ = (uVar4 & 0xf) != 2;
    }
    FVar3 = TT_Load_Context(exec_00,face_00,size);
    if (FVar3 != 0) {
      return FVar3;
    }
    if (*(int *)&pFVar1[2].root.library == 0x28) {
      bVar6 = gloader._6_1_ != (bool)exec_00->subpixel_hinting_lean;
      if (bVar6) {
        exec_00->subpixel_hinting_lean = gloader._6_1_;
      }
      bVar7 = gloader._5_1_ != exec_00->grayscale_cleartype;
      if (bVar7) {
        exec_00->grayscale_cleartype = gloader._5_1_;
      }
      gloader._4_1_ = bVar7 || bVar6;
    }
    if (gloader._7_1_ != (bool)exec_00->grayscale) {
      exec_00->grayscale = gloader._7_1_;
      gloader._4_1_ = true;
    }
    if (gloader._4_1_) {
      for (gloader._0_4_ = 0; (ulong)(uint)gloader < size->cvt_size;
          gloader._0_4_ = (uint)gloader + 1) {
        FVar5 = FT_MulFix_x86_64((int)face_00->cvt[(uint)gloader],(FT_Int32)(size->ttmetrics).scale)
        ;
        size->cvt[(uint)gloader] = (long)FVar5;
      }
      FVar3 = tt_size_run_prep(size,pedantic_00);
      if (FVar3 != 0) {
        return FVar3;
      }
    }
    if (((exec_00->GS).instruct_control & 1) != 0) {
      face._4_4_ = load_flags | 2;
    }
    if (((exec_00->GS).instruct_control & 2) != 0) {
      memcpy(&exec_00->GS,&tt_default_graphics_state,0x60);
    }
    exec_00->pedantic_hinting = (byte)face._4_4_ & 0x80;
    loader->exec = exec_00;
    loader->instructions = exec_00->glyphIns;
  }
  if (glyf_table_only == '\0') {
    loader_00 = glyph->internal->loader;
    FT_GlyphLoader_Rewind(loader_00);
    loader->gloader = loader_00;
  }
  loader->load_flags = (long)(int)face._4_4_;
  loader->face = face_00;
  loader->size = size;
  loader->glyph = glyph;
  loader->stream = pFVar2;
  (loader->composites).head = (FT_ListNode)0x0;
  (loader->composites).tail = (FT_ListNode)0x0;
  return 0;
}

Assistant:

static FT_Error
  tt_loader_init( TT_Loader     loader,
                  TT_Size       size,
                  TT_GlyphSlot  glyph,
                  FT_Int32      load_flags,
                  FT_Bool       glyf_table_only )
  {
    TT_Face    face;
    FT_Stream  stream;

#ifdef TT_USE_BYTECODE_INTERPRETER
    FT_Error   error;
    FT_Bool    pedantic = FT_BOOL( load_flags & FT_LOAD_PEDANTIC );
#if defined TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY || \
    defined TT_SUPPORT_SUBPIXEL_HINTING_MINIMAL
    TT_Driver  driver = (TT_Driver)FT_FACE_DRIVER( (TT_Face)glyph->face );
#endif
#endif


    face   = (TT_Face)glyph->face;
    stream = face->root.stream;

    FT_ZERO( loader );

#ifdef TT_USE_BYTECODE_INTERPRETER

    /* load execution context */
    if ( IS_HINTED( load_flags ) && !glyf_table_only )
    {
      TT_ExecContext  exec;
      FT_Bool         grayscale = TRUE;
#ifdef TT_SUPPORT_SUBPIXEL_HINTING_MINIMAL
      FT_Bool         subpixel_hinting_lean;
      FT_Bool         grayscale_cleartype;
#endif

#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
      FT_Bool  subpixel_hinting = FALSE;

#if 0
      /* not used yet */
      FT_Bool  compatible_widths;
      FT_Bool  symmetrical_smoothing;
      FT_Bool  bgr;
      FT_Bool  vertical_lcd;
      FT_Bool  subpixel_positioned;
      FT_Bool  gray_cleartype;
#endif
#endif /* TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY */

      FT_Bool  reexecute = FALSE;


      if ( size->bytecode_ready < 0 || size->cvt_ready < 0 )
      {
        error = tt_size_ready_bytecode( size, pedantic );
        if ( error )
          return error;
      }
      else if ( size->bytecode_ready )
        return size->bytecode_ready;
      else if ( size->cvt_ready )
        return size->cvt_ready;

      /* query new execution context */
      exec = size->context;
      if ( !exec )
        return FT_THROW( Could_Not_Find_Context );

#ifdef TT_SUPPORT_SUBPIXEL_HINTING_MINIMAL
      if ( driver->interpreter_version == TT_INTERPRETER_VERSION_40 )
      {
        subpixel_hinting_lean =
          FT_BOOL( FT_LOAD_TARGET_MODE( load_flags ) !=
                   FT_RENDER_MODE_MONO               );
        grayscale_cleartype =
          FT_BOOL( subpixel_hinting_lean         &&
                   !( ( load_flags         &
                        FT_LOAD_TARGET_LCD )   ||
                      ( load_flags           &
                        FT_LOAD_TARGET_LCD_V ) ) );
        exec->vertical_lcd_lean =
          FT_BOOL( subpixel_hinting_lean    &&
                   ( load_flags           &
                     FT_LOAD_TARGET_LCD_V ) );
      }
      else
      {
        subpixel_hinting_lean   = FALSE;
        grayscale_cleartype     = FALSE;
        exec->vertical_lcd_lean = FALSE;
      }
#endif

#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY

      if ( driver->interpreter_version == TT_INTERPRETER_VERSION_38 )
      {
        subpixel_hinting = FT_BOOL( ( FT_LOAD_TARGET_MODE( load_flags ) !=
                                      FT_RENDER_MODE_MONO               )  &&
                                    SPH_OPTION_SET_SUBPIXEL                );

        if ( subpixel_hinting )
          grayscale = FALSE;
        else if ( SPH_OPTION_SET_GRAYSCALE )
        {
          grayscale        = TRUE;
          subpixel_hinting = FALSE;
        }
        else
          grayscale = FALSE;

        if ( FT_IS_TRICKY( glyph->face ) )
          subpixel_hinting = FALSE;

        exec->ignore_x_mode      = subpixel_hinting || grayscale;
        exec->rasterizer_version = SPH_OPTION_SET_RASTERIZER_VERSION;
        if ( exec->sph_tweak_flags & SPH_TWEAK_RASTERIZER_35 )
          exec->rasterizer_version = TT_INTERPRETER_VERSION_35;

#if 1
        exec->compatible_widths     = SPH_OPTION_SET_COMPATIBLE_WIDTHS;
        exec->symmetrical_smoothing = TRUE;
        exec->bgr                   = FALSE;
        exec->vertical_lcd          = FALSE;
        exec->subpixel_positioned   = TRUE;
        exec->gray_cleartype        = FALSE;
#else /* 0 */
        exec->compatible_widths =
          FT_BOOL( FT_LOAD_TARGET_MODE( load_flags ) !=
                   TT_LOAD_COMPATIBLE_WIDTHS );
        exec->symmetrical_smoothing =
          FT_BOOL( FT_LOAD_TARGET_MODE( load_flags ) !=
                   TT_LOAD_SYMMETRICAL_SMOOTHING );
        exec->bgr =
          FT_BOOL( FT_LOAD_TARGET_MODE( load_flags ) !=
                   TT_LOAD_BGR );
        exec->vertical_lcd =
          FT_BOOL( FT_LOAD_TARGET_MODE( load_flags ) !=
                   TT_LOAD_VERTICAL_LCD );
        exec->subpixel_positioned =
          FT_BOOL( FT_LOAD_TARGET_MODE( load_flags ) !=
                   TT_LOAD_SUBPIXEL_POSITIONED );
        exec->gray_cleartype =
          FT_BOOL( FT_LOAD_TARGET_MODE( load_flags ) !=
                   TT_LOAD_GRAY_CLEARTYPE );
#endif /* 0 */

      }
      else

#endif /* TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY */

#ifdef TT_SUPPORT_SUBPIXEL_HINTING_MINIMAL
      if ( driver->interpreter_version == TT_INTERPRETER_VERSION_40 )
        grayscale = FT_BOOL( !subpixel_hinting_lean               &&
                             FT_LOAD_TARGET_MODE( load_flags ) !=
                               FT_RENDER_MODE_MONO                );
      else
#endif
        grayscale = FT_BOOL( FT_LOAD_TARGET_MODE( load_flags ) !=
                               FT_RENDER_MODE_MONO             );

      error = TT_Load_Context( exec, face, size );
      if ( error )
        return error;

#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY

      if ( driver->interpreter_version == TT_INTERPRETER_VERSION_38 )
      {
        /* a change from mono to subpixel rendering (and vice versa) */
        /* requires a re-execution of the CVT program                */
        if ( subpixel_hinting != exec->subpixel_hinting )
        {
          FT_TRACE4(( "tt_loader_init: subpixel hinting change,"
                      " re-executing `prep' table\n" ));

          exec->subpixel_hinting = subpixel_hinting;
          reexecute              = TRUE;
        }

        /* a change from mono to grayscale rendering (and vice versa) */
        /* requires a re-execution of the CVT program                 */
        if ( grayscale != exec->grayscale )
        {
          FT_TRACE4(( "tt_loader_init: grayscale hinting change,"
                      " re-executing `prep' table\n" ));

          exec->grayscale = grayscale;
          reexecute       = TRUE;
        }
      }
      else

#endif /* TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY */

      {

#ifdef TT_SUPPORT_SUBPIXEL_HINTING_MINIMAL
        if ( driver->interpreter_version == TT_INTERPRETER_VERSION_40 )
        {
          /* a change from mono to subpixel rendering (and vice versa) */
          /* requires a re-execution of the CVT program                */
          if ( subpixel_hinting_lean != exec->subpixel_hinting_lean )
          {
            FT_TRACE4(( "tt_loader_init: subpixel hinting change,"
                        " re-executing `prep' table\n" ));

            exec->subpixel_hinting_lean = subpixel_hinting_lean;
            reexecute                   = TRUE;
          }

          /* a change from colored to grayscale subpixel rendering (and */
          /* vice versa) requires a re-execution of the CVT program     */
          if ( grayscale_cleartype != exec->grayscale_cleartype )
          {
            FT_TRACE4(( "tt_loader_init: grayscale subpixel hinting change,"
                        " re-executing `prep' table\n" ));

            exec->grayscale_cleartype = grayscale_cleartype;
            reexecute                 = TRUE;
          }
        }
#endif

        /* a change from mono to grayscale rendering (and vice versa) */
        /* requires a re-execution of the CVT program                 */
        if ( grayscale != exec->grayscale )
        {
          FT_TRACE4(( "tt_loader_init: grayscale hinting change,"
                      " re-executing `prep' table\n" ));

          exec->grayscale = grayscale;
          reexecute       = TRUE;
        }
      }

      if ( reexecute )
      {
        FT_UInt  i;


        for ( i = 0; i < size->cvt_size; i++ )
          size->cvt[i] = FT_MulFix( face->cvt[i], size->ttmetrics.scale );
        error = tt_size_run_prep( size, pedantic );
        if ( error )
          return error;
      }

      /* check whether the cvt program has disabled hinting */
      if ( exec->GS.instruct_control & 1 )
        load_flags |= FT_LOAD_NO_HINTING;

      /* load default graphics state -- if needed */
      if ( exec->GS.instruct_control & 2 )
        exec->GS = tt_default_graphics_state;

#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
      /* check whether we have a font hinted for ClearType --           */
      /* note that this flag can also be modified in a glyph's bytecode */
      if ( driver->interpreter_version == TT_INTERPRETER_VERSION_38 &&
           exec->GS.instruct_control & 4                            )
        exec->ignore_x_mode = 0;
#endif

      exec->pedantic_hinting = FT_BOOL( load_flags & FT_LOAD_PEDANTIC );
      loader->exec = exec;
      loader->instructions = exec->glyphIns;
    }

#endif /* TT_USE_BYTECODE_INTERPRETER */

    /* get face's glyph loader */
    if ( !glyf_table_only )
    {
      FT_GlyphLoader  gloader = glyph->internal->loader;


      FT_GlyphLoader_Rewind( gloader );
      loader->gloader = gloader;
    }

    loader->load_flags = (FT_ULong)load_flags;

    loader->face   = face;
    loader->size   = size;
    loader->glyph  = (FT_GlyphSlot)glyph;
    loader->stream = stream;

    loader->composites.head = NULL;
    loader->composites.tail = NULL;

    return FT_Err_Ok;
  }